

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O0

uint32_t __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::GetPointeeTypeIdOfVar
          (InterfaceVariableScalarReplacement *this,Instruction *var)

{
  Op OVar1;
  uint32_t uVar2;
  IRContext *this_00;
  DefUseManager *this_01;
  Instruction *this_02;
  Instruction *ptr_type_inst;
  DefUseManager *def_use_mgr;
  uint32_t ptr_type_id;
  Instruction *var_local;
  InterfaceVariableScalarReplacement *this_local;
  
  OVar1 = Instruction::opcode(var);
  if (OVar1 != OpVariable) {
    __assert_fail("var->opcode() == spv::Op::OpVariable",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/interface_var_sroa.cpp"
                  ,0x254,
                  "uint32_t spvtools::opt::InterfaceVariableScalarReplacement::GetPointeeTypeIdOfVar(Instruction *)"
                 );
  }
  uVar2 = Instruction::type_id(var);
  this_00 = Pass::context(&this->super_Pass);
  this_01 = IRContext::get_def_use_mgr(this_00);
  this_02 = analysis::DefUseManager::GetDef(this_01,uVar2);
  OVar1 = Instruction::opcode(this_02);
  if (OVar1 != OpTypePointer) {
    __assert_fail("ptr_type_inst->opcode() == spv::Op::OpTypePointer && \"Variable must have a pointer type.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/interface_var_sroa.cpp"
                  ,0x25b,
                  "uint32_t spvtools::opt::InterfaceVariableScalarReplacement::GetPointeeTypeIdOfVar(Instruction *)"
                 );
  }
  uVar2 = Instruction::GetSingleWordInOperand(this_02,1);
  return uVar2;
}

Assistant:

uint32_t InterfaceVariableScalarReplacement::GetPointeeTypeIdOfVar(
    Instruction* var) {
  assert(var->opcode() == spv::Op::OpVariable);

  uint32_t ptr_type_id = var->type_id();
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  Instruction* ptr_type_inst = def_use_mgr->GetDef(ptr_type_id);

  assert(ptr_type_inst->opcode() == spv::Op::OpTypePointer &&
         "Variable must have a pointer type.");
  return ptr_type_inst->GetSingleWordInOperand(kOpTypePtrTypeInOperandIndex);
}